

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.h
# Opt level: O0

double Js::DateImplementation::GetTvLcl<Js::ScriptContext>
                 (double tv,ScriptContext *scriptContext,TZD *ptzd)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  DaylightTimeHelper *this;
  bool local_39;
  int local_38;
  int iStack_34;
  bool isDaylightSavings;
  int offset;
  int bias;
  double tvLcl;
  TZD *ptzd_local;
  ScriptContext *scriptContext_local;
  double tv_local;
  
  tvLcl = (double)ptzd;
  ptzd_local = (TZD *)scriptContext;
  scriptContext_local = (ScriptContext *)tv;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/DateImplementation.h"
                                ,0x119,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (tvLcl != 0.0) {
    *(undefined4 *)tvLcl = 0;
    *(undefined1 *)((long)tvLcl + 8) = 0;
  }
  BVar3 = JavascriptNumber::IsNan((double)scriptContext_local);
  if (((BVar3 != 0) || ((double)scriptContext_local < -8.64e+15)) ||
     (8.64e+15 < (double)scriptContext_local)) {
    tv_local = NumberConstants::NaN;
  }
  else {
    this = ScriptContext::GetDaylightTimeHelper((ScriptContext *)ptzd_local);
    tv_local = PlatformAgnostic::DateTime::DaylightTimeHelper::UtcToLocal
                         (this,(double)scriptContext_local,&stack0xffffffffffffffcc,&local_38,
                          &local_39);
    if (tvLcl != 0.0) {
      *(int *)tvLcl = -iStack_34;
      *(int *)((long)tvLcl + 4) = local_38;
      *(byte *)((long)tvLcl + 8) = local_39 & 1;
    }
  }
  return tv_local;
}

Assistant:

double DateImplementation::GetTvLcl(double tv, ScriptContext *scriptContext, TZD *ptzd)
    {
        Assert(scriptContext);

        double tvLcl;

        if (nullptr != ptzd)
        {
            ptzd->minutes = 0;
            ptzd->fDst = FALSE;
        }

        // See if we're out of range before conversion (UTC time value must be within this range)
        if (JavascriptNumber::IsNan(tv) || tv < ktvMin || tv > ktvMax)
        {
            return JavascriptNumber::NaN;
        }

        int bias;
        int offset;
        bool isDaylightSavings;
        tvLcl = scriptContext->GetDaylightTimeHelper()->UtcToLocal(tv, bias, offset, isDaylightSavings);
        if (nullptr != ptzd)
        {
            ptzd->minutes = -bias;
            ptzd->offset = offset;
            ptzd->fDst = isDaylightSavings;
        }
        return tvLcl;
    }